

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void * __thiscall
pugi::impl::anon_unknown_0::xpath_allocator::reallocate
          (xpath_allocator *this,void *ptr,size_t old_size,size_t new_size)

{
  long lVar1;
  ulong __n;
  ulong uVar2;
  void *__dest;
  long in_RCX;
  long in_RDX;
  void *in_RSI;
  long *in_RDI;
  xpath_memory_block *next;
  void *result;
  xpath_allocator *in_stack_fffffffffffffff8;
  
  __n = in_RDX + 7U & 0xfffffffffffffff8;
  uVar2 = in_RCX + 7U & 0xfffffffffffffff8;
  if ((in_RSI == (void *)0x0) || (*(ulong *)(*in_RDI + 8) < (in_RDI[1] - __n) + uVar2)) {
    __dest = allocate(in_stack_fffffffffffffff8,(size_t)in_RDI);
    if (__dest == (void *)0x0) {
      __dest = (void *)0x0;
    }
    else if (((in_RSI != (void *)0x0) &&
             (memcpy(__dest,in_RSI,__n), (void *)(*(long *)*in_RDI + 0x10) == in_RSI)) &&
            (lVar1 = **(long **)*in_RDI, lVar1 != 0)) {
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                (*(undefined8 *)*in_RDI);
      *(long *)*in_RDI = lVar1;
    }
  }
  else {
    in_RDI[1] = (in_RDI[1] - __n) + uVar2;
    __dest = in_RSI;
  }
  return __dest;
}

Assistant:

void* reallocate(void* ptr, size_t old_size, size_t new_size)
		{
			// round size up to block alignment boundary
			old_size = (old_size + xpath_memory_block_alignment - 1) & ~(xpath_memory_block_alignment - 1);
			new_size = (new_size + xpath_memory_block_alignment - 1) & ~(xpath_memory_block_alignment - 1);

			// we can only reallocate the last object
			assert(ptr == NULL || static_cast<char*>(ptr) + old_size == &_root->data[0] + _root_size);

			// try to reallocate the object inplace
			if (ptr && _root_size - old_size + new_size <= _root->capacity)
			{
				_root_size = _root_size - old_size + new_size;
				return ptr;
			}

			// allocate a new block
			void* result = allocate(new_size);
			if (!result) return NULL;

			// we have a new block
			if (ptr)
			{
				// copy old data (we only support growing)
				assert(new_size >= old_size);
				memcpy(result, ptr, old_size);

				// free the previous page if it had no other objects
				assert(_root->data == result);
				assert(_root->next);

				if (_root->next->data == ptr)
				{
					// deallocate the whole page, unless it was the first one
					xpath_memory_block* next = _root->next->next;

					if (next)
					{
						xml_memory::deallocate(_root->next);
						_root->next = next;
					}
				}
			}

			return result;
		}